

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunlinsol.c
# Opt level: O3

int Test_SUNLinSolSetScalingVectors(SUNLinearSolver S,N_Vector s1,N_Vector s2,int myid)

{
  uint uVar1;
  int iVar2;
  
  uVar1 = SUNLinSolSetScalingVectors(S,s1,s2);
  if (uVar1 == 0) {
    iVar2 = 0;
    if (myid == 0) {
      puts("    PASSED test -- SUNLinSolSetScalingVectors ");
      iVar2 = 0;
      if (print_time != 0) {
        printf("    SUNLinSolSetScalingVectors Time: %22.15e \n \n",0);
      }
    }
  }
  else {
    printf(">>> FAILED test -- SUNLinSolSetScalingVectors returned %d on Proc %d \n",(ulong)uVar1,
           (ulong)(uint)myid);
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int Test_SUNLinSolSetScalingVectors(SUNLinearSolver S, N_Vector s1,
                                    N_Vector s2, int myid)
{
  int       failure;
  double    start_time, stop_time;

  /* try calling SetScalingVectors routine: should pass/fail based on expected input */
  start_time = get_time();
  failure = SUNLinSolSetScalingVectors(S, s1, s2);
  stop_time = get_time(); 

  if (failure) {
    printf(">>> FAILED test -- SUNLinSolSetScalingVectors returned %d on Proc %d \n", 
           failure, myid);
    return(1);
  }
  else if (myid == 0) {
    printf("    PASSED test -- SUNLinSolSetScalingVectors \n");
    PRINT_TIME("    SUNLinSolSetScalingVectors Time: %22.15e \n \n", stop_time - start_time);
  }    

  return(0);
}